

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Read.cpp
# Opt level: O0

expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code> *
idx2::ReadChunk(expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code> *__return_storage_ptr__,
               idx2_file *Idx2,decode_data *D,u64 Brick,i8 Level,i8 Subband,i16 BpKey)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  ulong uVar5;
  mallocator *pmVar6;
  unsigned_long *Key;
  error<idx2::idx2_err_code> eVar7;
  byte local_439;
  long local_3f0;
  byte local_3c1;
  undefined1 local_370 [8];
  bitstream ChunkStream;
  i64 ChunkSize;
  i64 ChunkOffset;
  i32 ChunkPos;
  undefined2 local_320;
  bool bStack_31e;
  anon_class_8_1_1e916d15 local_308;
  chunk_cache *local_300;
  undefined2 local_2f8;
  undefined1 uStack_2f6;
  undefined5 uStack_2f5;
  undefined1 local_2f0 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:205:5)>
  __ScopeGuard__205;
  anon_class_8_1_3fcf61a8_for_Func __CleanUpFunc__205;
  FILE *Fp;
  timer IOTimer;
  chunk_cache *ChunkCache;
  anon_class_1_0_00000001 local_2a1 [12];
  undefined5 uStack_295;
  iterator local_290;
  unsigned_long *local_270;
  iterator ChunkCacheIt;
  file_cache *FileCache;
  u64 ChunkAddress;
  anon_class_8_1_1e916d15 local_230 [2];
  undefined5 uStack_21d;
  chunk_cache *local_218;
  anon_class_8_1_32d6a57b local_208 [2];
  undefined5 uStack_1f5;
  error<idx2::idx2_err_code> local_1f0;
  undefined1 local_1e0 [8];
  error<idx2::idx2_err_code> Result;
  iterator FileCacheIt;
  file_id FileId;
  i8 Subband_local;
  i8 Level_local;
  u64 Brick_local;
  decode_data *D_local;
  idx2_file *Idx2_local;
  undefined1 local_a0 [8];
  timespec End;
  i8 I;
  i8 I_1;
  
  Key = (unsigned_long *)(ulong)(uint)(int)Level;
  FileId.Id._6_1_ = Subband;
  FileId.Id._7_1_ = Level;
  ConstructFilePath((file_id *)&FileCacheIt.Idx,Idx2,Brick,Level,Subband,BpKey);
  Lookup<unsigned_long,idx2::file_cache>
            ((iterator *)&Result.Code,(idx2 *)&D->FileCacheTable,
             (hash_table<unsigned_long,_idx2::file_cache> *)&FileId.Name.Size,Key);
  eVar7 = ReadFile(Idx2,D,(iterator *)&Result.Code,(file_id *)&FileCacheIt.Idx);
  local_1f0.Msg = eVar7.Msg;
  local_1e0 = (undefined1  [8])local_1f0.Msg;
  local_1f0._8_2_ = eVar7._8_2_;
  Result.Msg._0_1_ = local_1f0.Code;
  Result.Msg._1_1_ = local_1f0.StackIdx;
  local_1f0.StrGened = eVar7.StrGened;
  Result.Msg._2_1_ = local_1f0.StrGened;
  local_1f0 = eVar7;
  bVar4 = error::operator_cast_to_bool((error *)local_1e0);
  if (bVar4) {
    if (*(char *)((long)&(FileCacheIt.Ht)->Keys +
                 (long)&(((FileCacheIt.Val)->ChunkOffsets).Buffer.Alloc)->_vptr_allocator) == '\x02'
       ) {
      if (0xf < FileId.Id._7_1_) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
      }
      uVar5 = (ulong)(Idx2->BricksPerChunk).Arr[(int)FileId.Id._7_1_];
      if (uVar5 == 0) {
        local_3c1 = 0xff;
      }
      else {
        lVar2 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        local_3c1 = 0x3f - ((byte)lVar2 ^ 0x3f);
      }
      FileCache = (file_cache *)
                  (((long)FileId.Id._7_1_ << 0x3c) +
                   (Brick >> (local_3c1 + (uVar5 != 1L << (local_3c1 & 0x3f)) & 0x3f)) * 0x40000 +
                   (long)((int)FileId.Id._6_1_ << 0xc) + (long)((long)BpKey & 0xfffU));
      ChunkCacheIt.Idx = (i64)FileCacheIt.Key;
      Lookup<unsigned_long,idx2::chunk_cache>
                (&local_290,(idx2 *)(FileCacheIt.Key + 6),
                 (hash_table<unsigned_long,_idx2::chunk_cache> *)&FileCache,
                 (unsigned_long *)((long)BpKey & 0xfffU));
      local_270 = local_290.Key;
      ChunkCacheIt.Key = (unsigned_long *)local_290.Val;
      ChunkCacheIt.Val = (chunk_cache *)local_290.Ht;
      ChunkCacheIt.Ht = (hash_table<unsigned_long,_idx2::chunk_cache> *)local_290.Idx;
      if (*(char *)((long)(unsigned_long **)local_290.Idx +
                   (((array<unsigned_long> *)&(local_290.Ht)->Vals)->Buffer).Bytes) == '\x02') {
        IOTimer.Start.tv_nsec = (__syscall_slong_t)local_290.Val;
        if (((local_290.Val)->ChunkStream).Stream.Bytes == 0) {
          clock_gettime(1,(timespec *)&Fp);
          __CleanUpFunc__205.Fp = (FILE **)fopen((char *)FileCacheIt.Idx,"rb");
          __ScopeGuard__205._8_8_ = &__CleanUpFunc__205;
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:205:5)>
          ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:205:5)>
                         *)local_2f0,
                        (anon_class_8_1_3fcf61a8_for_Func *)&__ScopeGuard__205.Dismissed);
          if (__CleanUpFunc__205.Fp == (FILE **)0x0) {
            local_308.FileId = (file_id *)&FileCacheIt.Idx;
            eVar7 = ReadChunk::anon_class_8_1_1e916d15::operator()(&local_308);
            local_300 = (chunk_cache *)eVar7.Msg;
            local_320 = eVar7._8_2_;
            local_2f8 = local_320;
            bStack_31e = eVar7.StrGened;
            uStack_2f6 = bStack_31e;
            __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002ffa40;
            (__return_storage_ptr__->field_1).Val = local_300;
            *(ulong *)((long)&__return_storage_ptr__->field_1 + 8) =
                 CONCAT53(uStack_2f5,eVar7._8_3_);
            __return_storage_ptr__->Ok = false;
            bVar4 = true;
          }
          else {
            iVar1 = *(int *)IOTimer.Start.tv_nsec;
            if (iVar1 < 1) {
              local_3f0 = 0;
            }
            else {
              local_3f0 = *(long *)(*(long *)ChunkCacheIt.Idx + (long)(iVar1 + -1) * 8);
            }
            ChunkStream._40_8_ = *(long *)(*(long *)ChunkCacheIt.Idx + (long)iVar1 * 8) - local_3f0;
            fseeko((FILE *)__CleanUpFunc__205.Fp,local_3f0,0);
            bitstream::bitstream((bitstream *)local_370);
            uVar3 = ChunkStream._40_8_;
            pmVar6 = Mallocator();
            (**(pmVar6->super_allocator)._vptr_allocator)(pmVar6,local_370,uVar3 + 8);
            ChunkStream.Stream.Alloc = (allocator *)local_370;
            ChunkStream.BitBuf._0_4_ = 0;
            ChunkStream.BitPtr = (byte *)0x0;
            fread((void *)local_370,(size_t)ChunkStream.Stream.Data,1,(FILE *)__CleanUpFunc__205.Fp)
            ;
            std::__atomic_base<unsigned_long>::operator+=
                      (&(D->BytesData_).super___atomic_base<unsigned_long>,
                       (__int_type_conflict)ChunkStream.Stream.Data);
            End.tv_nsec = (__syscall_slong_t)&Fp;
            clock_gettime(1,(timespec *)local_a0);
            std::__atomic_base<unsigned_long>::operator+=
                      (&(D->DecodeIOTime_).super___atomic_base<unsigned_long>,
                       (long)((double)((long)local_a0 - *(long *)End.tv_nsec) * 1000000000.0 +
                             (double)(End.tv_sec - *(long *)(End.tv_nsec + 8))));
            if (0xf < FileId.Id._7_1_) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]"
                           );
            }
            uVar5 = (ulong)(Idx2->BricksPerChunk).Arr[(int)FileId.Id._7_1_];
            if (uVar5 == 0) {
              local_439 = 0xff;
            }
            else {
              lVar2 = 0x3f;
              if (uVar5 != 0) {
                for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
                }
              }
              local_439 = 0x3f - ((byte)lVar2 ^ 0x3f);
            }
            DecompressChunk((bitstream *)local_370,(chunk_cache *)IOTimer.Start.tv_nsec,
                            (u64)FileCache,
                            (int)(char)(local_439 + (uVar5 != 1L << (local_439 & 0x3f))));
            bVar4 = false;
          }
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:205:5)>
          ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:205:5)>
                          *)local_2f0);
          if (bVar4) {
            return __return_storage_ptr__;
          }
        }
        __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002ffa40;
        (__return_storage_ptr__->field_1).Err.Msg = (cstr)ChunkCacheIt.Key;
        __return_storage_ptr__->Ok = true;
      }
      else {
        eVar7 = ReadChunk::anon_class_1_0_00000001::operator()(local_2a1);
        ChunkCache = (chunk_cache *)eVar7.Msg;
        __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002ffa40;
        (__return_storage_ptr__->field_1).Val = ChunkCache;
        *(ulong *)((long)&__return_storage_ptr__->field_1 + 8) = CONCAT53(uStack_295,eVar7._8_3_);
        __return_storage_ptr__->Ok = false;
      }
    }
    else {
      local_230[0].FileId = (file_id *)&FileCacheIt.Idx;
      eVar7 = ReadChunk::anon_class_8_1_1e916d15::operator()(local_230);
      ChunkAddress = (u64)eVar7.Msg;
      __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002ffa40;
      (__return_storage_ptr__->field_1).Val = (chunk_cache *)ChunkAddress;
      *(ulong *)((long)&__return_storage_ptr__->field_1 + 8) = CONCAT53(uStack_21d,eVar7._8_3_);
      __return_storage_ptr__->Ok = false;
    }
  }
  else {
    local_208[0].Result = (error<idx2::idx2_err_code> *)local_1e0;
    eVar7 = ReadChunk::anon_class_8_1_32d6a57b::operator()(local_208);
    local_218 = (chunk_cache *)eVar7.Msg;
    __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002ffa40;
    (__return_storage_ptr__->field_1).Val = local_218;
    *(ulong *)((long)&__return_storage_ptr__->field_1 + 8) = CONCAT53(uStack_1f5,eVar7._8_3_);
    __return_storage_ptr__->Ok = false;
  }
  return __return_storage_ptr__;
}

Assistant:

expected<const chunk_cache*, idx2_err_code>
ReadChunk(const idx2_file& Idx2, decode_data* D, u64 Brick, i8 Level, i8 Subband, i16 BpKey)
{
#if VISUS_IDX2
  if (Idx2.external_read)
  {
    u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, BpKey);
    auto ChunkCacheIt = Lookup(D->FileCache.ChunkCaches, ChunkAddress);
    if (ChunkCacheIt)
      return ChunkCacheIt.Val;

    bitstream ChunkStream;
    bool Result = Idx2.external_read(Idx2, ChunkStream.Stream, ChunkAddress).get();
    idx2_ReturnErrorIf(!Result, idx2_err_code::ChunkNotFound);

    //decompress part
    chunk_cache ChunkCache;
    DecompressChunk(&ChunkStream, &ChunkCache, ChunkAddress, Log2Ceil(Idx2.BricksPerChunk[Level]));
    Insert(&ChunkCacheIt, ChunkAddress, ChunkCache);
    return ChunkCacheIt.Val;
  }
#endif

  file_id FileId = ConstructFilePath(Idx2, Brick, Level, Subband, BpKey);
  auto FileCacheIt = Lookup(D->FileCacheTable, FileId.Id);
  idx2_PropagateIfError(ReadFile(Idx2, D, &FileCacheIt, FileId));
  if (!FileCacheIt)
    return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);

  /* find the appropriate chunk */
  u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, BpKey);
  //printf("chunk %llu\n", ChunkAddress);
  const file_cache* FileCache = FileCacheIt.Val;
  decltype(FileCache->ChunkCaches)::iterator ChunkCacheIt;
  ChunkCacheIt = Lookup(FileCache->ChunkCaches, ChunkAddress);
  if (!ChunkCacheIt)
    return idx2_Error(idx2_err_code::ChunkNotFound);
  chunk_cache* ChunkCache = ChunkCacheIt.Val;
  if (Size(ChunkCache->ChunkStream.Stream) == 0) // chunk has not been loaded
  {
    timer IOTimer;
    StartTimer(&IOTimer);
    idx2_RAII(FILE*, Fp = fopen(FileId.Name.ConstPtr, "rb"), , if (Fp) fclose(Fp));
    if (!Fp)
      return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);
    i32 ChunkPos = ChunkCache->ChunkPos;
    i64 ChunkOffset = ChunkPos > 0 ? FileCache->ChunkOffsets[ChunkPos - 1] : 0;
    i64 ChunkSize = FileCache->ChunkOffsets[ChunkPos] - ChunkOffset;
    idx2_FSeek(Fp, ChunkOffset, SEEK_SET);
    bitstream ChunkStream;
    // NOTE: not a memory leak since we will keep track of this in ChunkCache
    InitWrite(&ChunkStream, ChunkSize);
    ReadBuffer(Fp, &ChunkStream.Stream);
    D->BytesData_ += Size(ChunkStream.Stream);
    D->DecodeIOTime_ += ElapsedTime(&IOTimer);
    // TODO: check for error
    DecompressChunk(&ChunkStream, ChunkCache, ChunkAddress, Log2Ceil(Idx2.BricksPerChunk[Level]));
  }

  return ChunkCacheIt.Val;
}